

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_4::Repairer::ArchiveFile(Repairer *this,string *fname)

{
  char *__s;
  Logger *info_log;
  pointer pcVar1;
  char *pcVar2;
  Status s;
  Status local_98;
  string new_dir;
  string local_70;
  string new_file;
  
  __s = (fname->_M_dataplus)._M_p;
  pcVar2 = strrchr(__s,0x2f);
  new_dir._M_dataplus._M_p = (pointer)&new_dir.field_2;
  new_dir._M_string_length = 0;
  new_dir.field_2._M_local_buf[0] = '\0';
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&new_dir,(ulong)__s);
  }
  std::__cxx11::string::append((char *)&new_dir);
  (*this->env_->_vptr_Env[9])(&local_98,this->env_,&new_dir);
  Status::~Status(&local_98);
  std::__cxx11::string::string((string *)&new_file,(string *)&new_dir);
  std::__cxx11::string::append((char *)&new_file);
  std::__cxx11::string::append((char *)&new_file);
  (*this->env_->_vptr_Env[0xc])(&s,this->env_,fname,&new_file);
  info_log = (this->options_).info_log;
  pcVar1 = (fname->_M_dataplus)._M_p;
  Status::ToString_abi_cxx11_(&local_70,&s);
  Log(info_log,"Archiving %s: %s\n",pcVar1,local_70._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  Status::~Status(&s);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void ArchiveFile(const std::string& fname) {
    // Move into another directory.  E.g., for
    //    dir/foo
    // rename to
    //    dir/lost/foo
    const char* slash = strrchr(fname.c_str(), '/');
    std::string new_dir;
    if (slash != nullptr) {
      new_dir.assign(fname.data(), slash - fname.data());
    }
    new_dir.append("/lost");
    env_->CreateDir(new_dir);  // Ignore error
    std::string new_file = new_dir;
    new_file.append("/");
    new_file.append((slash == nullptr) ? fname.c_str() : slash + 1);
    Status s = env_->RenameFile(fname, new_file);
    Log(options_.info_log, "Archiving %s: %s\n", fname.c_str(),
        s.ToString().c_str());
  }